

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5NewTokenizerModule
              (Fts5Global *pGlobal,char *zName,void *pUserData,_func_void_void_ptr *xDestroy,
              Fts5TokenizerModule **ppNew)

{
  Fts5TokenizerModule *pFVar1;
  size_t sVar2;
  Fts5TokenizerModule *pFVar3;
  long in_FS_OFFSET;
  int rc;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  sVar2 = strlen(zName);
  pFVar3 = (Fts5TokenizerModule *)sqlite3Fts5MallocZero(&local_3c,sVar2 + 0x61);
  *ppNew = pFVar3;
  if (pFVar3 != (Fts5TokenizerModule *)0x0) {
    pFVar3->zName = (char *)(pFVar3 + 1);
    memcpy(pFVar3 + 1,zName,sVar2 + 1);
    pFVar3->pUserData = pUserData;
    pFVar3->xDestroy = xDestroy;
    pFVar1 = pGlobal->pTok;
    pFVar3->pNext = pFVar1;
    pGlobal->pTok = pFVar3;
    if (pFVar1 == (Fts5TokenizerModule *)0x0) {
      pGlobal->pDfltTok = pFVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5NewTokenizerModule(
  Fts5Global *pGlobal,            /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void *pUserData,                /* User data for aux. function */
  void(*xDestroy)(void*),         /* Destructor for pUserData */
  Fts5TokenizerModule **ppNew
){
  int rc = SQLITE_OK;
  Fts5TokenizerModule *pNew;
  sqlite3_int64 nName;          /* Size of zName and its \0 terminator */
  sqlite3_int64 nByte;          /* Bytes of space to allocate */

  nName = strlen(zName) + 1;
  nByte = sizeof(Fts5TokenizerModule) + nName;
  *ppNew = pNew = (Fts5TokenizerModule*)sqlite3Fts5MallocZero(&rc, nByte);
  if( pNew ){
    pNew->zName = (char*)&pNew[1];
    memcpy(pNew->zName, zName, nName);
    pNew->pUserData = pUserData;
    pNew->xDestroy = xDestroy;
    pNew->pNext = pGlobal->pTok;
    pGlobal->pTok = pNew;
    if( pNew->pNext==0 ){
      pGlobal->pDfltTok = pNew;
    }
  }

  return rc;
}